

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  pointer pSVar1;
  ContextState *pCVar2;
  Subcase *this_00;
  
  pCVar2 = getContextState::data;
  if (this->m_entered == true) {
    getContextState::data->subcasesCurrentLevel = getContextState::data->subcasesCurrentLevel + -1;
    if (pCVar2->subcasesHasSkipped == false) {
      std::
      _Rb_tree<doctest::detail::SubcaseSignature,doctest::detail::SubcaseSignature,std::_Identity<doctest::detail::SubcaseSignature>,std::less<doctest::detail::SubcaseSignature>,std::allocator<doctest::detail::SubcaseSignature>>
      ::_M_insert_unique<doctest::detail::SubcaseSignature_const&>
                ((_Rb_tree<doctest::detail::SubcaseSignature,doctest::detail::SubcaseSignature,std::_Identity<doctest::detail::SubcaseSignature>,std::less<doctest::detail::SubcaseSignature>,std::allocator<doctest::detail::SubcaseSignature>>
                  *)&pCVar2->subcasesPassed,&this->m_signature);
    }
    pSVar1 = (pCVar2->subcasesStack).
             super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar1 != (pCVar2->subcasesStack).
                  super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = pSVar1 + -1;
      (pCVar2->subcasesStack).
      super__Vector_base<doctest::detail::Subcase,_std::allocator<doctest::detail::Subcase>_>.
      _M_impl.super__Vector_impl_data._M_finish = this_00;
      ~Subcase(this_00);
    }
    (pCVar2->super_TestAccessibleContextState).hasLoggedCurrentTestStart = false;
  }
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            ContextState* s = getContextState();

            s->subcasesCurrentLevel--;
            // only mark the subcase as passed if no subcases have been skipped
            if(s->subcasesHasSkipped == false)
                s->subcasesPassed.insert(m_signature);

            if(s->subcasesStack.size() > 0)
                s->subcasesStack.pop_back();
            if(s->hasLoggedCurrentTestStart)
                logTestEnd();
            s->hasLoggedCurrentTestStart = false;
        }
    }